

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionsMap.h
# Opt level: O0

set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
__thiscall dg::dda::DefinitionsMap<dg::dda::RWNode>::values(DefinitionsMap<dg::dda::RWNode> *this)

{
  bool bVar1;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> in_RSI;
  _Base_ptr in_RDI;
  pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>
  *it2;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *__range4;
  value_type *it;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<dg::dda::RWNode_*,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>,_std::hash<dg::dda::RWNode_*>,_std::equal_to<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>_>
  *__range3;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *ret;
  unordered_map<dg::dda::RWNode_*,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>,_std::hash<dg::dda::RWNode_*>,_std::equal_to<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>_>
  *in_stack_ffffffffffffff78;
  _Rb_tree_const_iterator<dg::dda::RWNode_*> __last;
  _Self local_50;
  _Self local_48;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *local_40;
  reference local_38;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __last._M_node = in_RDI;
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::set
            ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)0x178205);
  local_28[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<dg::dda::RWNode_*,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>,_std::hash<dg::dda::RWNode_*>,_std::equal_to<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>_>
       ::begin(in_stack_ffffffffffffff78);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<dg::dda::RWNode_*,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>,_std::hash<dg::dda::RWNode_*>,_std::equal_to<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  while (bVar1 = std::__detail::operator!=(local_28,&local_30), bVar1) {
    local_38 = std::__detail::
               _Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
               ::operator*((_Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                            *)0x17824f);
    local_40 = &local_38->second;
    local_48._M_node =
         (_Base_ptr)
         ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::begin
                   ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)
                    in_stack_ffffffffffffff78);
    local_50._M_node =
         (_Base_ptr)
         ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::end
                   ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)
                    in_stack_ffffffffffffff78);
    while (bVar1 = std::operator!=(&local_48,&local_50), bVar1) {
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                   *)0x17829f);
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::begin((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
               *)in_stack_ffffffffffffff78);
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::end((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
             *)in_stack_ffffffffffffff78);
      std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>::
      insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>>
                ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                  *)in_RDI,in_RSI,__last);
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    *)in_RDI);
    }
    std::__detail::
    _Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
    ::operator++((_Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                  *)in_RDI);
  }
  return (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
         )__last._M_node;
}

Assistant:

std::set<NodeT *> values() const {
        std::set<NodeT *> ret;
        for (auto &it : _definitions) {
            for (auto &it2 : it.second) {
                ret.insert(it2.second.begin(), it2.second.end());
            }
        }
        return ret;
    }